

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
::
emplace_value<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
          (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           *this,field_type i,allocator_type *alloc,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  ulong src_i;
  byte bVar3;
  btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
  bVar4;
  btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
  *c;
  undefined7 in_register_00000031;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  bVar3 = btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
          ::start((btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                   *)this);
  if (i < bVar3) {
    __assert_fail("i >= start()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x709,
                  "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<>>]"
                 );
  }
  if (((ulong)this & 7) == 0) {
    bVar4 = this[10];
    if ((byte)bVar4 < i) {
      __assert_fail("i <= finish()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x70a,
                    "void absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>>::emplace_value(const field_type, allocator_type *, Args &&...) [Params = absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<>>]"
                   );
    }
    src_i = (ulong)i;
    iVar6 = (int)CONCAT71(in_register_00000031,i);
    if (i < (byte)bVar4) {
      btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
      ::transfer_n_backward
                ((btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                  *)this,(long)(int)((uint)(byte)bVar4 - iVar6),(ulong)(iVar6 + 1),src_i,
                 (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                  *)this,alloc);
    }
    pbVar1 = (args_1->
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
             ._M_head_impl;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    *(size_type *)(this + src_i * 0x18 + 0x10) = pbVar1->_M_string_length;
    *(pointer *)(this + src_i * 0x18 + 0x18) = pcVar2;
    *(undefined8 *)(this + src_i * 0x18 + 0x20) = 0;
    uVar5 = (uint)(byte)this[10];
    bVar4 = (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
             )((char)this[10] + 1);
    this[10] = bVar4;
    if (this[0xb] ==
        (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
         )0x0) {
      uVar7 = iVar6 + 1;
      bVar9 = uVar7 < (byte)bVar4;
      if (bVar9) {
        while (bVar9) {
          uVar8 = uVar5 & 0xff;
          c = btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
              ::child((btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                       *)this,(field_type)uVar5);
          btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
          ::set_child((btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                       *)this,(field_type)uVar5 + '\x01',c);
          uVar5 = uVar8 - 1;
          bVar9 = uVar7 < uVar8;
        }
        btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
        ::mutable_child((btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                         *)this,(field_type)uVar7);
        return;
      }
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsi..." /* TRUNCATED STRING LITERAL */
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const field_type i,
                                         allocator_type *alloc,
                                         Args &&...args) {
  assert(i >= start());
  assert(i <= finish());
  // Shift old values to create space for new value and then construct it in
  // place.
  if (i < finish()) {
    transfer_n_backward(finish() - i, /*dest_i=*/i + 1, /*src_i=*/i, this,
                        alloc);
  }
  value_init(static_cast<field_type>(i), alloc, std::forward<Args>(args)...);
  set_finish(finish() + 1);

  if (is_internal() && finish() > i + 1) {
    for (field_type j = finish(); j > i + 1; --j) {
      set_child(j, child(j - 1));
    }
    clear_child(i + 1);
  }
}